

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O1

void __thiscall
duckdb::MultiFileColumnMap::MultiFileColumnMap
          (MultiFileColumnMap *this,idx_t index,LogicalType *param_2,LogicalType *global_type)

{
  bool bVar1;
  
  (this->mapping).index = index;
  (this->mapping).child_mapping._M_h._M_buckets =
       &(this->mapping).child_mapping._M_h._M_single_bucket;
  (this->mapping).child_mapping._M_h._M_bucket_count = 1;
  (this->mapping).child_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mapping).child_mapping._M_h._M_element_count = 0;
  (this->mapping).child_mapping._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mapping).child_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mapping).child_mapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->local_type = param_2;
  this->global_type = global_type;
  bVar1 = LogicalType::operator==(param_2,global_type);
  this->filter_conversion = (uint)!bVar1;
  return;
}

Assistant:

MultiFileColumnMap(idx_t index, const LogicalType &local_type, const LogicalType &global_type)
	    : mapping(index), local_type(local_type), global_type(global_type),
	      filter_conversion(local_type == global_type ? FilterConversionType::COPY_DIRECTLY
	                                                  : FilterConversionType::CAST_FILTER) {
	}